

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O1

LY_ERR schema_mount_sprinter_tree_node_override_parent_refs
                 (lysc_node *node,void *plugin_priv,ly_bool *skip,char **UNUSED_flags,
                 char **add_opts)

{
  long lVar1;
  lysc_module *plVar2;
  ulong uVar3;
  lysc_node *plVar4;
  
  lVar1 = *(long *)((long)plugin_priv + 8);
  plVar2 = node->module->compiled;
  *skip = '\x01';
  if (*(int *)(lVar1 + 4) != 0) {
    uVar3 = 0;
    do {
      if (*skip == '\0') break;
      plVar4 = *(lysc_node **)(*(long *)(lVar1 + 8) + uVar3 * 8);
      if (plVar4 != (lysc_node *)0x0 && plVar4->module->compiled == plVar2) {
        do {
          if (plVar4 == node) {
            *skip = '\0';
            break;
          }
          plVar4 = plVar4->parent;
        } while (plVar4 != (lysc_node *)0x0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(uint *)(lVar1 + 4));
  }
  if ((*skip == '\0') && (node->parent == (lysc_node *)0x0)) {
    *add_opts = "@";
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
schema_mount_sprinter_tree_node_override_parent_refs(const struct lysc_node *node, const void *plugin_priv,
        ly_bool *skip, const char **UNUSED(flags), const char **add_opts)
{
    uint32_t i;
    const struct ly_set *refs;
    const struct lysc_module *mod;
    struct lysc_node *ref, *iter;

    refs = ((struct sprinter_tree_priv *)plugin_priv)->refs;
    mod = node->module->compiled;

    /* Assume the @p node will be skipped. */
    *skip = 1;
    for (i = 0; (i < refs->count) && *skip; i++) {
        ref = refs->snodes[i];
        if (ref->module->compiled != mod) {
            /* parent-reference points to different module */
            continue;
        }

        for (iter = ref; iter; iter = iter->parent) {
            if (iter == node) {
                /* @p node is not skipped because it is parent-rererence node or his parent */
                *skip = 0;
                break;
            }
        }
    }

    if (!*skip && !node->parent) {
        /* top-node has additional opts */
        *add_opts = "@";
    }

    return LY_SUCCESS;
}